

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

Path * Path::canonicalized(Path *__return_storage_ptr__,Path *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_type *local_40;
  size_type local_38;
  size_type local_30;
  undefined8 uStack_28;
  
  pcVar2 = (path->super_String).mString._M_dataplus._M_p;
  local_40 = &local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + (path->super_String).mString._M_string_length);
  sVar4 = canonicalize((Path *)&local_40);
  paVar1 = &(__return_storage_ptr__->super_String).mString.field_2;
  sVar3 = (path->super_String).mString._M_string_length;
  (__return_storage_ptr__->super_String).mString._M_dataplus._M_p = (pointer)paVar1;
  if (sVar4 == sVar3) {
    pcVar2 = (path->super_String).mString._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar4);
    if (local_40 != &local_30) {
      operator_delete(local_40);
    }
  }
  else {
    if (local_40 == &local_30) {
      paVar1->_M_allocated_capacity = local_30;
      *(undefined8 *)((long)&(__return_storage_ptr__->super_String).mString.field_2 + 8) = uStack_28
      ;
    }
    else {
      (__return_storage_ptr__->super_String).mString._M_dataplus._M_p = (pointer)local_40;
      (__return_storage_ptr__->super_String).mString.field_2._M_allocated_capacity = local_30;
    }
    (__return_storage_ptr__->super_String).mString._M_string_length = local_38;
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::canonicalized(const Path &path)
{
    Path p = path;
    if (p.canonicalize() != path.size())
        return p;
    return path; // same as above
}